

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void f2c(ct22 *a)

{
  __atomic_base<int> _Var1;
  __int_type _Var2;
  ostream *poVar3;
  int *in_RDI;
  rep_conflict rVar4;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_fffffffffffffeb8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffec0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffec8;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  bool bVar5;
  undefined8 in_stack_ffffffffffffff00;
  bool local_a2;
  bool local_a1;
  duration<double,_std::ratio<1L,_1L>_> local_90 [2];
  undefined8 local_80;
  rep local_78;
  duration<double,_std::ratio<1L,_1L>_> local_70 [4];
  int *local_50;
  __atomic_base<int> local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  atomic<int> *local_20;
  __atomic_base<int> local_18;
  uint local_14;
  undefined4 local_10;
  uint local_c;
  atomic<int> *local_8;
  
  local_50 = in_RDI;
  if (second_round) {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffec8);
    local_a1 = true;
    if (-1 < _Var2) goto LAB_00121744;
  }
  else {
LAB_00121744:
    local_a2 = false;
    if ((second_round & 1U) == 0) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffec8);
      local_a2 = -1 < _Var2;
    }
    local_a1 = local_a2;
  }
  local_14 = (uint)local_a1;
  local_8 = &success_counter;
  local_10 = 5;
  LOCK();
  UNLOCK();
  local_18 = success_counter.super___atomic_base<int>._M_i;
  local_c = local_14;
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       (__atomic_base<int>)(success_counter.super___atomic_base<int>._M_i + local_14)._M_i;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar3 = std::operator<<((ostream *)&std::cerr,"f2c ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_50);
  poVar3 = std::operator<<(poVar3," begin: ");
  local_80 = std::chrono::_V2::system_clock::now();
  local_78 = (rep)std::chrono::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             &in_stack_fffffffffffffec8->__d);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_70);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121988);
  fun(SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0),(int)in_stack_ffffffffffffff00);
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar3 = std::operator<<((ostream *)&std::cerr,"f2c ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_50);
  poVar3 = std::operator<<(poVar3," end: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             &in_stack_fffffffffffffec8->__d);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_90);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121a90);
  local_20 = &x;
  local_24 = 0x20;
  local_28 = 5;
  local_2c = 0x20;
  LOCK();
  _Var1 = x.super___atomic_base<int>._M_i + 0x20;
  UNLOCK();
  local_30 = x.super___atomic_base<int>._M_i;
  x.super___atomic_base<int>._M_i = (__atomic_base<int>)(__atomic_base<int>)_Var1._M_i;
  if ((second_round & 1U) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffec8);
    bVar5 = true;
    if (_Var2 < 0) goto LAB_00121bc4;
  }
  bVar5 = false;
  if ((second_round & 1U) == 0) {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffec8);
    bVar5 = -1 < _Var2;
  }
LAB_00121bc4:
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       (__atomic_base<int>)(success_counter.super___atomic_base<int>._M_i + (uint)bVar5)._M_i;
  UNLOCK();
  return;
}

Assistant:

void f2c(const ct22& a)
{ 
  success_counter.fetch_add((second_round && (x<0)) || (!second_round && (x>=0)));
  LOG("f2c " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count()); 
  //a[0]++;
  fun(true);
  LOG("f2c " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  x.fetch_add(32);
  success_counter.fetch_add((second_round && (x<0)) || (!second_round && (x>=0)));
}